

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DerTypes.h
# Opt level: O3

bool __thiscall Enumerated::Decode(Enumerated *this,uchar *pIn,size_t cbIn,size_t *cbUsed)

{
  bool bVar1;
  length_error *this_00;
  size_t sVar2;
  code *pcVar3;
  undefined *puVar4;
  size_t local_38;
  size_t size;
  size_t cbPrefix;
  
  local_38 = 0;
  size = 0;
  if (cbIn < 3) {
    if ((cbIn == 2) && (pIn[1] == '\0')) {
      local_38 = 2;
      size = 2;
LAB_001225da:
      if (local_38 + size != 3) {
        this_00 = (length_error *)__cxa_allocate_exception(0x10);
        std::length_error::length_error(this_00,"Incorrect decode");
        puVar4 = &std::length_error::typeinfo;
        pcVar3 = std::length_error::~length_error;
        goto LAB_0012265c;
      }
      this->value = pIn[2];
      sVar2 = 3;
      bVar1 = true;
      goto LAB_001225f6;
    }
  }
  else if ((char)*pIn < '\0' || *pIn == '\n') {
    bVar1 = DecodeSize(pIn + 1,cbIn - 1,&local_38,&size);
    if (bVar1) {
      if (size + local_38 + 1 <= cbIn) {
        size = size + 1;
        goto LAB_001225da;
      }
    }
    this_00 = (length_error *)__cxa_allocate_exception(0x10);
    std::out_of_range::out_of_range((out_of_range *)this_00,"Illegal size value");
    puVar4 = &std::out_of_range::typeinfo;
    pcVar3 = std::out_of_range::~out_of_range;
LAB_0012265c:
    __cxa_throw(this_00,puVar4,pcVar3);
  }
  bVar1 = false;
  sVar2 = 0;
LAB_001225f6:
  *cbUsed = sVar2;
  return bVar1;
}

Assistant:

virtual bool Decode(const unsigned char* pIn, size_t cbIn, size_t& cbUsed) override
	{
		size_t size = 0;
		size_t cbPrefix = 0;
		if (!CheckDecode(pIn, cbIn, DerType::Enumerated, size, cbPrefix))
		{
			cbUsed = 0;
			return false;
		}

		// Now check specifics for this type
		if (cbPrefix + size != 3)
			throw std::length_error("Incorrect decode");

		value = pIn[2];
		cbUsed = 3;
		return true;
	}